

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O2

double eval_arg<double>(char *s,double min,double max)

{
  istream *piVar1;
  runtime_error *this;
  allocator<char> local_1c9;
  double local_1c8;
  double local_1c0;
  double value;
  string local_1b0 [32];
  istringstream in;
  
  local_1c8 = min;
  local_1c0 = max;
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,s,&local_1c9);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,local_1b0,_S_in);
  std::__cxx11::string::~string(local_1b0);
  piVar1 = std::istream::_M_extract<double>((double *)&in);
  if (((((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) && (local_1c8 <= value))
     && (value <= local_1c0)) {
    local_1c8 = value;
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    return local_1c8;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid value");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T eval_arg(const char* s, T min, T max)
{
    T value;
    std::istringstream in{s};

    if (!(in >> value) || value < min || value > max)
        throw std::runtime_error("invalid value");

    return value;
}